

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::ConvertModel
          (FBXConverter *this,Model *model,aiNode *nd,aiMatrix4x4 *node_global_transform)

{
  uint uVar1;
  pointer ppGVar2;
  Geometry *pGVar3;
  pointer puVar4;
  MeshGeometry *mesh;
  LineGeometry *line;
  uint *__s;
  pointer puVar5;
  pointer ppGVar6;
  _Alloc_hider _Var7;
  aiMatrix4x4 *in_R8;
  ulong uVar8;
  ulong __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  Model *local_1d8;
  aiMatrix4x4 *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  uint *local_1a8;
  uint *local_1a0;
  ios_base local_138 [264];
  
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = node_global_transform;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_1f8,
             (long)(model->geometry).
                   super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model->geometry).
                   super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppGVar6 = (model->geometry).
            super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppGVar2 = (model->geometry).
            super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_1d8 = model;
  if (ppGVar6 != ppGVar2) {
    do {
      pGVar3 = *ppGVar6;
      if (pGVar3 == (Geometry *)0x0) {
        mesh = (MeshGeometry *)0x0;
        line = (LineGeometry *)0x0;
      }
      else {
        mesh = (MeshGeometry *)__dynamic_cast(pGVar3,&Geometry::typeinfo,&MeshGeometry::typeinfo);
        node_global_transform = (aiMatrix4x4 *)0x0;
        line = (LineGeometry *)__dynamic_cast(pGVar3,&Geometry::typeinfo,&LineGeometry::typeinfo);
      }
      if (mesh == (MeshGeometry *)0x0) {
        if (line != (LineGeometry *)0x0) {
          ConvertLine((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a8,this,line,
                      (Model *)node_global_transform,in_R8,nd);
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (local_1a8,local_1a0,&local_1f8);
          goto LAB_0017406c;
        }
        std::operator+(&local_1c8,"ignoring unrecognized geometry: ",&(pGVar3->super_Object).name);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a8,
                   &local_1c8);
        LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        _Var7._M_p = local_1c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_00174076;
      }
      else {
        node_global_transform = (aiMatrix4x4 *)local_1d8;
        in_R8 = local_1d0;
        ConvertMesh((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a8,this,mesh,
                    local_1d8,local_1d0,nd);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (local_1a8,local_1a0,&local_1f8);
LAB_0017406c:
        _Var7._M_p = (pointer)local_1a8;
        if (local_1a8 != (uint *)0x0) {
LAB_00174076:
          operator_delete(_Var7._M_p);
        }
      }
      ppGVar6 = ppGVar6 + 1;
    } while (ppGVar6 != ppGVar2);
  }
  puVar4 = local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar8 = (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    __n = -(ulong)(uVar8 >> 0x3e != 0) |
          (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    __s = (uint *)operator_new__(__n);
    memset(__s,0,__n);
    nd->mMeshes = __s;
    nd->mNumMeshes = (uint)uVar8;
    for (; puVar5 != puVar4; puVar5 = puVar5 + 1) {
      uVar1 = *puVar5;
      *puVar5 = *__s;
      *__s = uVar1;
      __s = __s + 1;
    }
  }
  if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::ConvertModel(const Model& model, aiNode& nd, const aiMatrix4x4& node_global_transform)
        {
            const std::vector<const Geometry*>& geos = model.GetGeometry();

            std::vector<unsigned int> meshes;
            meshes.reserve(geos.size());

            for (const Geometry* geo : geos) {

                const MeshGeometry* const mesh = dynamic_cast<const MeshGeometry*>(geo);
                const LineGeometry* const line = dynamic_cast<const LineGeometry*>(geo);
                if (mesh) {
                    const std::vector<unsigned int>& indices = ConvertMesh(*mesh, model, node_global_transform, nd);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else if (line) {
                    const std::vector<unsigned int>& indices = ConvertLine(*line, model, node_global_transform, nd);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else {
                    FBXImporter::LogWarn("ignoring unrecognized geometry: " + geo->Name());
                }
            }

            if (meshes.size()) {
                nd.mMeshes = new unsigned int[meshes.size()]();
                nd.mNumMeshes = static_cast<unsigned int>(meshes.size());

                std::swap_ranges(meshes.begin(), meshes.end(), nd.mMeshes);
            }
        }